

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

bool cfd::core::Transaction::CheckTxOutBuffer
               (uint8_t *buffer,size_t buf_size,uint64_t txout_num,size_t txout_num_size,
               void *tx_pointer,
               vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txout_list)

{
  allocator<unsigned_char> *this;
  size_t sVar1;
  bool bVar2;
  CfdException *this_00;
  uchar *__dest;
  size_type __n;
  Amount AVar3;
  ByteData local_1d0;
  Script local_1b8;
  int64_t local_180;
  undefined1 local_178;
  Amount local_170;
  undefined1 local_160 [8];
  TxOut out;
  undefined1 local_108 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_array;
  allocator local_d9;
  string local_d8;
  CfdSourceLocation local_b8;
  int local_9c;
  size_t sStack_98;
  int ret;
  size_t vnum_size;
  uint64_t script_size;
  uint64_t amount;
  size_t total;
  size_t limit;
  uint8_t *work_address;
  uint64_t index;
  uint8_t *puStack_58;
  bool is_error;
  uint8_t *address_pointer;
  size_t offset;
  size_t data_size;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *pvStack_38;
  bool is_success;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txout_list_local;
  void *tx_pointer_local;
  size_t txout_num_size_local;
  uint64_t txout_num_local;
  size_t buf_size_local;
  uint8_t *buffer_local;
  
  data_size._7_1_ = 0;
  if (txout_num_size < buf_size) {
    offset = buf_size - txout_num_size;
    address_pointer = (uint8_t *)0x0;
    puStack_58 = buffer + txout_num_size;
    index._7_1_ = 0;
    pvStack_38 = txout_list;
    txout_list_local = (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)tx_pointer;
    tx_pointer_local = (void *)txout_num_size;
    txout_num_size_local = txout_num;
    txout_num_local = buf_size;
    buf_size_local = (size_t)buffer;
    for (work_address = (uint8_t *)0x0; work_address < txout_num_size_local;
        work_address = work_address + 1) {
      if (offset - (long)address_pointer < 9) {
        index._7_1_ = 1;
        break;
      }
      script_size = *(uint64_t *)(puStack_58 + (long)address_pointer);
      limit = (long)(puStack_58 + (long)address_pointer) + 8;
      total = (offset - (long)address_pointer) - 8;
      amount = 8;
      vnum_size = 0;
      sStack_98 = 0;
      bVar2 = AbstractTransaction::GetVariableInt
                        ((uint8_t *)limit,total,&vnum_size,&stack0xffffffffffffff68);
      if (!bVar2) {
        index._7_1_ = 1;
        break;
      }
      if (total < sStack_98 + vnum_size) {
        index._7_1_ = 1;
        break;
      }
      limit = sStack_98 + limit;
      amount = sStack_98 + vnum_size + amount;
      address_pointer = address_pointer + amount;
      if (txout_list_local != (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0) {
        local_9c = wally_tx_add_raw_output
                             ((wally_tx *)txout_list_local,script_size,(uchar *)limit,vnum_size,0);
        if (local_9c != 0) {
          local_b8.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_transaction.cpp"
                       ,0x2f);
          local_b8.filename = local_b8.filename + 1;
          local_b8.line = 0x10f;
          local_b8.funcname = "CheckTxOutBuffer";
          logger::warn<int&>(&local_b8,"wally_tx_add_raw_output NG[{}].",&local_9c);
          byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
          this_00 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_d8,"vout add error.",&local_d9);
          CfdException::CfdException(this_00,kCfdIllegalStateError,&local_d8);
          byte_array.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
          __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
        }
        local_9c = 0;
      }
      sVar1 = vnum_size;
      if (pvStack_38 != (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)0x0) {
        this = (allocator<unsigned_char> *)
               ((long)&out.super_AbstractTxOut.locking_script_.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data + 0x17);
        ::std::allocator<unsigned_char>::allocator(this);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,sVar1,this);
        ::std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&out.super_AbstractTxOut.locking_script_.script_stack_.
                           super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ._M_impl.super__Vector_impl_data + 0x17));
        __dest = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
        sVar1 = limit;
        __n = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
        memcpy(__dest,(void *)sVar1,__n);
        AVar3 = Amount::CreateBySatoshiAmount(script_size);
        local_180 = AVar3.amount_;
        local_178 = AVar3.ignore_check_;
        local_170.amount_ = local_180;
        local_170.ignore_check_ = (bool)local_178;
        ByteData::ByteData(&local_1d0,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
        Script::Script(&local_1b8,&local_1d0);
        TxOut::TxOut((TxOut *)local_160,&local_170,&local_1b8);
        Script::~Script(&local_1b8);
        ByteData::~ByteData(&local_1d0);
        ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::push_back
                  (pvStack_38,(value_type *)local_160);
        TxOut::~TxOut((TxOut *)local_160);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
      }
    }
    if (((index._7_1_ & 1) == 0) && ((uint8_t *)offset == address_pointer)) {
      data_size._7_1_ = 1;
    }
  }
  return (bool)(data_size._7_1_ & 1);
}

Assistant:

bool Transaction::CheckTxOutBuffer(
    const uint8_t *buffer, size_t buf_size, uint64_t txout_num,
    size_t txout_num_size, void *tx_pointer, std::vector<TxOut> *txout_list) {
  bool is_success = false;
  if (buf_size > txout_num_size) {
    size_t data_size = buf_size - txout_num_size;
    size_t offset = 0;
    const uint8_t *address_pointer = buffer;
    address_pointer += txout_num_size;
    bool is_error = false;
    for (uint64_t index = 0; index < txout_num; ++index) {
      const uint8_t *work_address = &address_pointer[offset];
      size_t limit = data_size - offset;
      size_t total = 0;
      // check for value
      if (limit <= sizeof(int64_t)) {
        is_error = true;
        break;
      }
      uint64_t amount;
      memcpy(&amount, work_address, sizeof(amount));
      work_address += sizeof(uint64_t);
      limit -= sizeof(uint64_t);
      total += sizeof(uint64_t);
      // Check locking script
      uint64_t script_size = 0;
      size_t vnum_size = 0;
      if (!GetVariableInt(work_address, limit, &script_size, &vnum_size)) {
        is_error = true;
        break;
      } else if (limit < (vnum_size + script_size)) {
        is_error = true;
        break;
      }
      work_address += vnum_size;
      total += vnum_size + script_size;
      offset += total;

      // Copy of TxOut
      if (tx_pointer != NULL) {
        int ret = wally_tx_add_raw_output(
            static_cast<struct wally_tx *>(tx_pointer), amount, work_address,
            script_size, 0);
        if (ret != WALLY_OK) {
          warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}].", ret);
          throw CfdException(kCfdIllegalStateError, "vout add error.");
        }
      }
      if (txout_list != nullptr) {
        std::vector<uint8_t> byte_array(script_size);
        memcpy(byte_array.data(), work_address, byte_array.size());
        TxOut out(
            Amount::CreateBySatoshiAmount(amount),
            Script(ByteData(byte_array)));
        txout_list->push_back(out);
      }
    }

    if ((!is_error) && (data_size == offset)) {
      is_success = true;
    }
  }
  return is_success;
}